

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcache_test.cc
# Opt level: O1

void multi_thread_test(int nblocks,int cachesize,int blocksize,int time_sec,int nwriters,
                      int nreaders)

{
  pthread_t __th;
  size_t len;
  undefined8 uVar1;
  uint32_t uVar2;
  ulong uVar3;
  bid_t *__s;
  filemgr_ops *ops;
  filemgr *file;
  ulong uVar4;
  pthread_t *ppVar5;
  int iVar6;
  bid_t bid;
  pthread_t *__newthread;
  void **ppvVar7;
  void **__thread_return;
  ulong *__arg;
  filemgr_open_result fVar8;
  void *pvStack_e0;
  undefined1 auStack_d8 [8];
  filemgr_config config;
  timeval __test_begin;
  
  pvStack_e0 = (void *)0x1028ac;
  gettimeofday((timeval *)&config.do_not_cache_doc_blocks,(__timezone_ptr_t)0x0);
  iVar6 = nreaders + nwriters;
  uVar4 = (ulong)iVar6;
  uVar3 = uVar4 * 8 + 0xf & 0xfffffffffffffff0;
  ppVar5 = (pthread_t *)(auStack_d8 + -uVar3);
  __arg = (ulong *)((long)ppVar5 - (uVar4 * 0x28 + 0xf & 0xfffffffffffffff0));
  ppvVar7 = (void **)((long)__arg - uVar3);
  ppvVar7[-1] = (void *)0x102900;
  system("rm -rf  bcache_testfile");
  ppvVar7[-1] = (void *)0x102905;
  memleak_start();
  ppvVar7[-1] = (void *)0x10290f;
  __s = (bid_t *)malloc(0x1000);
  ppvVar7[-1] = (void *)0x102921;
  memset(__s,0,0x1000);
  config.options = '\0';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 0;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  auStack_d8._4_4_ = cachesize;
  auStack_d8._0_4_ = blocksize;
  config.blocksize = 0;
  config.ncacheblock = 0;
  config.flag = 8;
  config.chunksize = 0;
  config.prefetch_duration = 8;
  ppvVar7[-1] = (void *)0x10295e;
  ops = get_filemgr_ops();
  ppvVar7[-1] = (void *)0x102972;
  fVar8 = filemgr_open("./bcache_testfile",ops,(filemgr_config *)auStack_d8,(err_log_callback *)0x0)
  ;
  file = fVar8.file;
  if (nblocks != 0) {
    bid = 0;
    do {
      *__s = bid;
      __s[1] = 0;
      ppvVar7[-1] = (void *)0x10;
      len = (size_t)ppvVar7[-1];
      ppvVar7[-1] = (void *)0x102998;
      uVar2 = crc32_8(__s,len,0);
      *(uint32_t *)(__s + 2) = uVar2;
      ppvVar7[-1] = (void *)0x1;
      uVar1 = ppvVar7[-1];
      ppvVar7[-1] = (void *)0x1029b3;
      bcache_write(file,bid,__s,(bcache_dirty_t)uVar1,false,false);
      bid = bid + 1;
    } while ((long)nblocks != bid);
  }
  if (iVar6 != 0) {
    uVar3 = 0;
    __newthread = ppVar5;
    do {
      *__arg = uVar3;
      __arg[1] = (ulong)file;
      __arg[2] = (ulong)(uVar3 < (ulong)(long)nwriters);
      __arg[3] = (long)nblocks;
      __arg[4] = (long)time_sec;
      ppvVar7[-1] = (void *)0x102a18;
      pthread_create(__newthread,(pthread_attr_t *)0x0,worker,__arg);
      uVar3 = uVar3 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 5;
    } while (uVar4 != uVar3);
  }
  ppvVar7[-1] = (void *)0x102a42;
  printf("wait for %d seconds..\n",(ulong)(uint)time_sec);
  if (iVar6 != 0) {
    uVar3 = 0;
    __thread_return = ppvVar7;
    do {
      __th = ppVar5[uVar3];
      ppvVar7[-1] = (void *)0x102a5f;
      pthread_join(__th,__thread_return);
      uVar3 = uVar3 + 1;
      __thread_return = __thread_return + 1;
    } while (uVar4 != uVar3);
  }
  ppvVar7[-1] = (void *)0x1;
  uVar1 = ppvVar7[-1];
  ppvVar7[-1] = (void *)0x102a7e;
  filemgr_commit(file,SUB81(uVar1,0),(err_log_callback *)0x0);
  ppvVar7[-1] = (void *)0x102a8c;
  filemgr_close(file,SUB81(uVar1,0),(char *)0x0,(err_log_callback *)0x0);
  ppvVar7[-1] = (void *)0x102a91;
  filemgr_shutdown();
  ppvVar7[-1] = (void *)0x102a9a;
  free(__s);
  ppvVar7[-1] = (void *)0x102a9f;
  memleak_end();
  ppvVar7[-1] = (void *)0x102abe;
  fprintf(_stderr,"%s PASSED\n","multi thread test");
  return;
}

Assistant:

void multi_thread_test(
    int nblocks, int cachesize, int blocksize, int time_sec, int nwriters, int nreaders)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    int n = nwriters + nreaders;
    uint64_t i, j;
    uint32_t crc;
    uint8_t *buf;
    int r;
    char *fname = (char *) "./bcache_testfile";
    thread_t *tid = alca(thread_t, n);
    struct worker_args *args = alca(struct worker_args, n);
    void **ret = alca(void *, n);

    r = system(SHELL_DEL " bcache_testfile");
    (void)r;

    memleak_start();

    buf = (uint8_t *)malloc(4096);
    memset(buf, 0, 4096);

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = cachesize;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;

    for (i=0;i<(uint64_t)nblocks;++i) {
        memcpy(buf, &i, sizeof(i));
        j = 0;
        memcpy(buf + sizeof(i), &j, sizeof(j));
        crc = crc32_8(buf, sizeof(i) + sizeof(j), 0);
        memcpy(buf + sizeof(i) + sizeof(j), &crc, sizeof(crc));
        bcache_write(file, (bid_t)i, buf, BCACHE_REQ_DIRTY, false, false);
    }

    for (i=0;i<(uint64_t)n;++i){
        args[i].n = i;
        args[i].file = file;
        args[i].writer = ((i<(uint64_t)nwriters)?(1):(0));
        args[i].nblocks = nblocks;
        args[i].time_sec = time_sec;
        thread_create(&tid[i], worker, &args[i]);
    }

    DBG("wait for %d seconds..\n", time_sec);
    for (i=0;i<(uint64_t)n;++i){
        thread_join(tid[i], &ret[i]);
    }

    filemgr_commit(file, true, NULL);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(buf);

    memleak_end();
    TEST_RESULT("multi thread test");
}